

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderPrimitiveCounter::createAndBuildProgramWithFeedback
          (GeometryShaderPrimitiveCounter *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  TestError *this_00;
  GeometryShaderPrimitiveCounter *this_01;
  string geometry_shader_code;
  string max_vertices_string;
  string n_loop_iterations_string;
  char *geometry_shader_code_ptr;
  char *feedbackVaryings [1];
  stringstream n_loop_iterations_sstream;
  Context local_330 [3];
  ios_base local_2c0 [264];
  stringstream max_vertices_sstream;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  long lVar7;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar7 + 0x3c8))();
  this->m_program_id = GVar3;
  feedbackVaryings[0] = "test_gl_PrimitiveIDIn";
  this->m_nrVaryings = 1;
  (**(code **)(lVar7 + 0x14c8))(GVar3,1,feedbackVaryings,0x8c8c);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"Could not set transform feedback varyings!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x205);
  GVar3 = (**(code **)(lVar7 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_geometry_shader_id = GVar3;
  GVar3 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  this->m_fragment_shader_id = GVar3;
  GVar3 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
  this->m_vertex_shader_id = GVar3;
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x20b);
  std::__cxx11::stringstream::stringstream((stringstream *)&max_vertices_sstream);
  max_vertices_string._M_string_length = 0;
  max_vertices_string.field_2._M_local_buf[0] = '\0';
  max_vertices_string._M_dataplus._M_p = (pointer)&max_vertices_string.field_2;
  (**(code **)(lVar7 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES,
             &this->m_maxGeometryOutputVertices);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"Could not query GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x213);
  uVar5 = (uint)this->m_maxGeometryOutputVertices / (this->m_nrVaryings + this->m_n_components);
  this->m_maxGeometryOutputVertices = uVar5;
  std::ostream::operator<<(local_1a8,uVar5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&max_vertices_string,(string *)&n_loop_iterations_sstream);
  if (_n_loop_iterations_sstream != local_330) {
    operator_delete(_n_loop_iterations_sstream,
                    (ulong)((long)&(local_330[0].m_testCtx)->m_platform + 1));
  }
  uVar5 = (this->m_testConfiguration).m_numberOfVerticesPerOneOutputPrimitive;
  uVar6 = (uint)this->m_maxGeometryOutputVertices / uVar5;
  this->m_maxGeometryOutputVertices = uVar5 * uVar6;
  std::__cxx11::stringstream::stringstream((stringstream *)&n_loop_iterations_sstream);
  n_loop_iterations_string._M_string_length = 0;
  n_loop_iterations_string.field_2._M_local_buf[0] = '\0';
  n_loop_iterations_string._M_dataplus._M_p = (pointer)&n_loop_iterations_string.field_2;
  std::ostream::operator<<(local_330,uVar6);
  std::__cxx11::stringbuf::str();
  this_01 = (GeometryShaderPrimitiveCounter *)&geometry_shader_code;
  std::__cxx11::string::operator=((string *)&n_loop_iterations_string,(string *)this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)geometry_shader_code._M_dataplus._M_p != &geometry_shader_code.field_2) {
    this_01 = (GeometryShaderPrimitiveCounter *)
              (geometry_shader_code.field_2._M_allocated_capacity + 1);
    operator_delete(geometry_shader_code._M_dataplus._M_p,(ulong)this_01);
  }
  GetGeometryShaderCode
            (&geometry_shader_code,this_01,&max_vertices_string,
             &(this->m_testConfiguration).m_layoutIn,&(this->m_testConfiguration).m_layoutOut,
             &(this->m_testConfiguration).m_emitVertexCodeForGeometryShader,
             &n_loop_iterations_string);
  geometry_shader_code_ptr = geometry_shader_code._M_dataplus._M_p;
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_program_id,this->m_fragment_shader_id,1,
                     &m_fragment_shader_code,this->m_geometry_shader_id,1,&geometry_shader_code_ptr,
                     this->m_vertex_shader_id,1,&m_vertex_shader_code,(bool *)0x0);
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)geometry_shader_code._M_dataplus._M_p != &geometry_shader_code.field_2) {
      operator_delete(geometry_shader_code._M_dataplus._M_p,
                      geometry_shader_code.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)n_loop_iterations_string._M_dataplus._M_p != &n_loop_iterations_string.field_2) {
      operator_delete(n_loop_iterations_string._M_dataplus._M_p,
                      CONCAT71(n_loop_iterations_string.field_2._M_allocated_capacity._1_7_,
                               n_loop_iterations_string.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&n_loop_iterations_sstream);
    std::ios_base::~ios_base(local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)max_vertices_string._M_dataplus._M_p != &max_vertices_string.field_2) {
      operator_delete(max_vertices_string._M_dataplus._M_p,
                      CONCAT71(max_vertices_string.field_2._M_allocated_capacity._1_7_,
                               max_vertices_string.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&max_vertices_sstream);
    std::ios_base::~ios_base(local_138);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program could not have been created sucessfully",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
             ,0x232);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderPrimitiveCounter::createAndBuildProgramWithFeedback(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create a program object */
	m_program_id = gl.createProgram();

	/* Specify transform feedback varyings */
	const char* feedbackVaryings[] = { "test_gl_PrimitiveIDIn" };

	m_nrVaryings = sizeof(feedbackVaryings) / sizeof(char*);

	gl.transformFeedbackVaryings(m_program_id, m_nrVaryings, feedbackVaryings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set transform feedback varyings!");

	/* Create shader objects that will make up the program object */
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed");

	/* Retrieve GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT pname value and use it as argument for
	 * max_vertices layout qualifier of the geometry shader. */
	std::stringstream max_vertices_sstream;
	std::string		  max_vertices_string;

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES, &m_maxGeometryOutputVertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT!");

	m_maxGeometryOutputVertices = m_maxGeometryOutputVertices / (m_n_components + m_nrVaryings);

	max_vertices_sstream << m_maxGeometryOutputVertices;
	max_vertices_string = max_vertices_sstream.str();

	/* Calculate the possible for loops count in Geometry Shader */
	glw::GLint n_loop_iterations =
		m_maxGeometryOutputVertices / m_testConfiguration.m_numberOfVerticesPerOneOutputPrimitive;

	/* adjust the m_maxGeometryOutputVertices to be the number of emitted vertices  */
	m_maxGeometryOutputVertices = n_loop_iterations * m_testConfiguration.m_numberOfVerticesPerOneOutputPrimitive;

	std::stringstream n_loop_iterations_sstream;
	std::string		  n_loop_iterations_string;

	n_loop_iterations_sstream << n_loop_iterations;
	n_loop_iterations_string = n_loop_iterations_sstream.str();

	/* Construct geometry shader code */
	std::string geometry_shader_code =
		GetGeometryShaderCode(max_vertices_string, m_testConfiguration.m_layoutIn, m_testConfiguration.m_layoutOut,
							  m_testConfiguration.m_emitVertexCodeForGeometryShader, n_loop_iterations_string);

	const char* geometry_shader_code_ptr = (const char*)geometry_shader_code.c_str();

	/* Build program */
	if (!buildProgram(m_program_id, m_fragment_shader_id, 1, &m_fragment_shader_code, m_geometry_shader_id, 1,
					  &geometry_shader_code_ptr, m_vertex_shader_id, 1, &m_vertex_shader_code))
	{
		TCU_FAIL("Program could not have been created sucessfully");
	}
}